

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

cio_error cio_websocket_close(cio_websocket *websocket,cio_websocket_status_code status_code,
                             char *reason,cio_websocket_write_handler_t handler,
                             void *handler_context)

{
  cio_timer *timer;
  undefined1 *puVar1;
  cio_error cVar2;
  
  if (handler == (cio_websocket_write_handler_t)0x0 || websocket == (cio_websocket *)0x0) {
    cVar2 = CIO_INVALID_ARGUMENT;
  }
  else if ((websocket->ws_private).write_close_job.wbh == (cio_write_buffer *)0x0) {
    prepare_close_job_string
              (websocket,status_code,reason,handler,handler_context,close_frame_written);
    timer = &(websocket->ws_private).close_timer;
    cVar2 = cio_timer_init(timer,(((websocket->ws_private).http_client)->socket).impl.loop,
                           (cio_timer_close_hook_t)0x0);
    if (cVar2 == CIO_SUCCESS) {
      cVar2 = cio_timer_expires_from_now(timer,10000000000,close_timeout_handler,websocket);
      if (cVar2 == CIO_SUCCESS) {
        puVar1 = &(websocket->ws_private).ws_flags.field_0x1;
        *puVar1 = *puVar1 | 2;
        enqueue_job(websocket,&(websocket->ws_private).write_close_job,
                    (((websocket->ws_private).write_close_job.wbh)->data).element.length);
        cVar2 = CIO_SUCCESS;
      }
      else {
        cio_timer_close(timer);
      }
    }
  }
  else {
    cVar2 = CIO_OPERATION_NOT_PERMITTED;
  }
  return cVar2;
}

Assistant:

enum cio_error cio_websocket_close(struct cio_websocket *websocket, enum cio_websocket_status_code status_code, const char *reason, cio_websocket_write_handler_t handler, void *handler_context)
{
	if (cio_unlikely((websocket == NULL)) || (handler == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(websocket->ws_private.write_close_job.wbh != NULL)) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	prepare_close_job_string(websocket, status_code, reason, handler, handler_context, close_frame_written);

	struct cio_http_client *client = websocket->ws_private.http_client;
	enum cio_error err = cio_timer_init(&websocket->ws_private.close_timer, client->socket.impl.loop, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	err = cio_timer_expires_from_now(&websocket->ws_private.close_timer, CLOSE_TIMEOUT_NS, close_timeout_handler, websocket);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto timer_expires_failed;
	}

	websocket->ws_private.ws_flags.self_initiated_close = 1;
	size_t length = cio_write_buffer_get_total_size(websocket->ws_private.write_close_job.wbh);
	enqueue_job(websocket, &websocket->ws_private.write_close_job, length);

	return CIO_SUCCESS;

timer_expires_failed:
	cio_timer_close(&websocket->ws_private.close_timer);
	return err;
}